

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_manager.cpp
# Opt level: O0

void __thiscall
cfdcore_manager_GetSupportedFunction_Test::TestBody(cfdcore_manager_GetSupportedFunction_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_50;
  Message local_48 [3];
  uint64_t local_30;
  unsigned_long local_28;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  cfdcore_manager_GetSupportedFunction_Test *this_local;
  
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  local_28 = cfd::core::GetSupportedFunction();
  local_30 = GetSupportedFunctionExpect();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_20,"GetSupportedFunction()","GetSupportedFunctionExpect()",
             &local_28,&local_30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_48);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_manager.cpp"
               ,0x35,message);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message(local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  return;
}

Assistant:

TEST(cfdcore_manager, GetSupportedFunction) {
  EXPECT_EQ(GetSupportedFunction(), GetSupportedFunctionExpect());
}